

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O1

void __thiscall
UnscentedKalmanFilter::UnscentedKalmanFilter(UnscentedKalmanFilter *this,UKFParameters *p)

{
  VectorXd *pVVar1;
  VectorXd *this_00;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  DenseIndex DVar7;
  DenseIndex DVar8;
  double *pdVar9;
  undefined1 auVar10 [16];
  double dVar11;
  Index size;
  ostream *poVar12;
  undefined8 *puVar13;
  Index index;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  Matrix<double,__1,_1,_0,__1,_1> *other;
  double dVar19;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  this->_vptr_UnscentedKalmanFilter = (_func_int **)&PTR__UnscentedKalmanFilter_0014fd00;
  this->std_a_ = p->std_a;
  this->std_yawdd_ = p->std_yawdd;
  this->pred_rate_ = p->pred_rate;
  this->debug_ = p->debug;
  this->type_ = p->type;
  this->k_ = p->k;
  this->alpha_ = p->alpha;
  this->beta_ = p->beta;
  this->n_x_ = 5;
  this->n_aug_ = 7;
  this->n_sigma_ = 0xf;
  this->restart_ = false;
  this->is_initialized_ = false;
  this->previous_measurement_ = (Measurement *)0x0;
  this->current_sensor_ = (Sensor *)0x0;
  (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->weights_c_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->weights_c_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&local_48,5,5,1);
  pdVar6 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       local_48.m_data;
  DVar7 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       local_48.m_rows;
  local_48.m_data = pdVar6;
  local_48.m_rows = DVar7;
  free(pdVar6);
  local_48.m_data = (double *)0x0;
  local_48.m_rows = 0;
  local_48.m_cols = 0;
  uVar14 = (ulong)this->n_x_;
  if (-1 < (long)uVar14) {
    if ((this->n_x_ != 0) &&
       (auVar10._8_8_ = 0, auVar10._0_8_ = uVar14,
       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar10,0) < (long)uVar14)) {
      puVar13 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar13 = operator_delete;
      __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_48,uVar14 * uVar14,uVar14,uVar14);
    pdVar6 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
    (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         local_48.m_data;
    DVar7 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows;
    (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         local_48.m_rows;
    DVar8 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols;
    (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         local_48.m_cols;
    local_48.m_data = pdVar6;
    local_48.m_rows = DVar7;
    local_48.m_cols = DVar8;
    free(pdVar6);
    local_48.m_data = (double *)0x0;
    local_48.m_rows = 0;
    local_48.m_cols = 0;
    uVar2 = this->n_x_;
    lVar17 = (long)(int)uVar2;
    uVar3 = this->n_sigma_;
    lVar15 = (long)(int)uVar3;
    if (-1 < (int)(uVar3 | uVar2)) {
      if ((uVar3 != 0 && uVar2 != 0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar15),0) < lVar17))
      {
        puVar13 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar13 = operator_delete;
        __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_48,lVar15 * lVar17,lVar17,lVar15);
      pVVar1 = &this->weights_m_;
      this_00 = &this->weights_c_;
      pdVar6 = (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
      (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_data = local_48.m_data;
      DVar7 = (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows;
      (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows = local_48.m_rows;
      DVar8 = (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols;
      (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols = local_48.m_cols;
      local_48.m_data = pdVar6;
      local_48.m_rows = DVar7;
      local_48.m_cols = DVar8;
      free(pdVar6);
      if (this->type_ == UKFScaled) {
        this->lambda_ =
             (double)(this->k_ + this->n_aug_) * this->alpha_ * this->alpha_ - (double)this->n_aug_;
        iVar4 = this->n_sigma_;
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,_1,_0> *)&local_48,(long)iVar4,(long)iVar4,1);
        if (-1 < iVar4) {
          pdVar6 = (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data;
          (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_data = local_48.m_data;
          DVar7 = (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows;
          (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows = local_48.m_rows;
          local_48.m_data = pdVar6;
          local_48.m_rows = DVar7;
          free(pdVar6);
          iVar4 = this->n_sigma_;
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,_1,_0> *)&local_48,(long)iVar4,(long)iVar4,1);
          if (-1 < iVar4) {
            pdVar6 = (this->weights_c_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            ;
            (this->weights_c_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_data = local_48.m_data;
            DVar7 = (this->weights_c_).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
            (this->weights_c_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows = local_48.m_rows;
            local_48.m_data = pdVar6;
            local_48.m_rows = DVar7;
            free(pdVar6);
            lVar15 = (this->weights_m_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            ;
            if (0 < lVar15) {
              pdVar6 = (this->weights_m_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data;
              dVar11 = (double)this->n_aug_;
              *pdVar6 = this->lambda_ / (this->lambda_ + dVar11);
              lVar17 = (this->weights_c_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows;
              if (0 < lVar17) {
                pdVar9 = (this->weights_c_).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data;
                *pdVar9 = (double)this->beta_ + (1.0 - this->alpha_ * this->alpha_) +
                          this->lambda_ / (this->lambda_ + dVar11);
                iVar4 = this->n_sigma_;
                if (1 < (long)iVar4) {
                  lVar18 = 1;
                  do {
                    if (lVar17 == lVar18) goto LAB_0011ae16;
                    dVar19 = 0.5 / (this->lambda_ + dVar11);
                    pdVar9[lVar18] = dVar19;
                    if (lVar15 == lVar18) goto LAB_0011ae16;
                    pdVar6[lVar18] = dVar19;
                    lVar18 = lVar18 + 1;
                  } while (iVar4 != lVar18);
                }
                goto LAB_0011ad57;
              }
            }
            goto LAB_0011ae16;
          }
        }
      }
      else {
        this->lambda_ = (double)(this->k_ - this->n_aug_);
        iVar4 = this->n_sigma_;
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,_1,_0> *)&local_48,(long)iVar4,(long)iVar4,1);
        if (-1 < iVar4) {
          pdVar6 = (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data;
          (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_data = local_48.m_data;
          DVar7 = (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows;
          (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows = local_48.m_rows;
          local_48.m_data = pdVar6;
          local_48.m_rows = DVar7;
          free(pdVar6);
          lVar15 = (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   .m_storage.m_rows;
          if (0 < lVar15) {
            pdVar6 = (this->weights_m_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            ;
            iVar4 = this->n_aug_;
            *pdVar6 = this->lambda_ / (this->lambda_ + (double)iVar4);
            iVar5 = this->n_sigma_;
            if (1 < (long)iVar5) {
              lVar17 = 1;
              do {
                if (lVar15 == lVar17) goto LAB_0011ae16;
                pdVar6[lVar17] = 0.5 / (this->lambda_ + (double)iVar4);
                lVar17 = lVar17 + 1;
              } while (iVar5 != lVar17);
            }
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                       lVar15,1);
            uVar14 = (this->weights_c_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            ;
            if (uVar14 != (this->weights_m_).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_rows) {
              __assert_fail("rows() == other.rows() && cols() == other.cols()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Assign.h"
                            ,0x1f9,
                            "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
                           );
            }
            uVar16 = uVar14 - ((long)uVar14 >> 0x3f) & 0xfffffffffffffffe;
            if (1 < (long)uVar14) {
              lVar15 = 0;
              do {
                pdVar6 = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data + lVar15;
                dVar11 = pdVar6[1];
                pdVar9 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data + lVar15;
                *pdVar9 = *pdVar6;
                pdVar9[1] = dVar11;
                lVar15 = lVar15 + 2;
              } while (lVar15 < (long)uVar16);
            }
            if ((long)uVar16 < (long)uVar14) {
              pdVar6 = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data;
              pdVar9 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data;
              do {
                pdVar9[uVar16] = pdVar6[uVar16];
                uVar16 = uVar16 + 1;
              } while (uVar14 != uVar16);
            }
LAB_0011ad57:
            if (0 < this->debug_) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Weights m:\n",0xb);
              local_48.m_data = (double *)pVVar1;
              poVar12 = Eigen::operator<<((ostream *)&std::cout,
                                          (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           *)&local_48);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
              std::ostream::put((char)poVar12);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Weights c:\n",0xb);
              local_48.m_data = (double *)this_00;
              poVar12 = Eigen::operator<<((ostream *)&std::cout,
                                          (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           *)&local_48);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
              std::ostream::put((char)poVar12);
              std::ostream::flush();
            }
            return;
          }
LAB_0011ae16:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x18a,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
      }
      __assert_fail("dim >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Matrix.h"
                    ,0xf0,
                    "Eigen::Matrix<double, -1, 1>::Matrix(Index) [_Scalar = double, _Rows = -1, _Cols = 1, _Options = 0, _MaxRows = -1, _MaxCols = 1]"
                   );
    }
  }
  local_48.m_cols = 0;
  local_48.m_rows = 0;
  local_48.m_data = (double *)0x0;
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/PlainObjectBase.h"
                ,0xf1,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

UnscentedKalmanFilter::UnscentedKalmanFilter(const UnscentedKalmanFilter::UKFParameters &p) :
    std_a_(p.std_a),
    std_yawdd_(p.std_yawdd),
    debug_(p.debug),
    pred_rate_(p.pred_rate),
    type_(p.type),
    k_(p.k),
    alpha_(p.alpha),
    beta_(p.beta),

    n_x_(5),
    n_aug_(n_x_+2),
    n_sigma_(2*n_aug_+1),

    restart_(false),
    is_initialized_(false),

    previous_measurement_(0),
    current_sensor_(0)
{
  // initial state vector
  x_ = VectorXd(n_x_);

  // initial covariance matrix
  P_ = MatrixXd(n_x_, n_x_);

  Xsig_pred_ = MatrixXd(n_x_, n_sigma_); 

  if (type_ != UKFScaled) {
  
      // set weights for classic style of UKF

      lambda_ = k_ - n_aug_;

      weights_m_ = VectorXd(n_sigma_);
      
      weights_m_(0)= lambda_ / (lambda_+n_aug_);
      
      for (int i=1; i<n_sigma_; i++) {  //2n+1 weights
          weights_m_(i) = .5/(n_aug_+lambda_);
      }

      weights_c_ = weights_m_;

  } else {

      // set weights for scaled type of UKF

      lambda_ = alpha_*alpha_*(n_aug_+k_) - n_aug_;
  
      weights_m_ = VectorXd(n_sigma_);
      weights_c_ = VectorXd(n_sigma_);

      weights_m_(0) = lambda_/(lambda_+n_aug_);
      weights_c_(0) = lambda_/(lambda_+n_aug_) + (1-alpha_*alpha_ + beta_);

      for (int i=1; i<n_sigma_; i++) {  // 2n+1 weights
          weights_m_(i) = weights_c_(i) = .5/(n_aug_+lambda_);
      }
  }

  if (debug_ > 0) { 
      std::cout << "Weights m:\n" << weights_m_.transpose() << std::endl;
      std::cout << "Weights c:\n" << weights_c_.transpose() << std::endl;
  }
}